

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O1

bool __thiscall
QUdpSocketPrivate::doEnsureInitialized
          (QUdpSocketPrivate *this,QHostAddress *bindAddress,quint16 bindPort,
          QHostAddress *remoteAddress)

{
  QAbstractSocketEngine *pQVar1;
  char cVar2;
  bool bVar3;
  NetworkLayerProtocol NVar4;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  NVar4 = QHostAddress::protocol(bindAddress);
  if (NVar4 == UnknownNetworkLayerProtocol) {
    QHostAddress::protocol(remoteAddress);
    bindAddress = remoteAddress;
  }
  pQVar1 = (this->super_QAbstractSocketPrivate).socketEngine;
  if (pQVar1 == (QAbstractSocketEngine *)0x0) {
LAB_001ca0ab:
    QHostAddress::toString(&local_48,remoteAddress);
    QAbstractSocketPrivate::resolveProxy(&this->super_QAbstractSocketPrivate,&local_48,bindPort);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    NVar4 = QHostAddress::protocol(bindAddress);
    bVar3 = QAbstractSocketPrivate::initSocketLayer(&this->super_QAbstractSocketPrivate,NVar4);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_001ca104;
    }
  }
  else {
    cVar2 = (**(code **)(*(long *)pQVar1 + 0x78))();
    if (cVar2 == '\0') goto LAB_001ca0ab;
  }
  bVar3 = true;
LAB_001ca104:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QUdpSocketPrivate::doEnsureInitialized(const QHostAddress &bindAddress, quint16 bindPort,
                                            const QHostAddress &remoteAddress)
{
    const QHostAddress *address = &bindAddress;
    QAbstractSocket::NetworkLayerProtocol proto = address->protocol();
    if (proto == QUdpSocket::UnknownNetworkLayerProtocol) {
        address = &remoteAddress;
        proto = address->protocol();
    }

    // now check if the socket engine is initialized and to the right type
    if (!socketEngine || !socketEngine->isValid()) {
        resolveProxy(remoteAddress.toString(), bindPort);
        if (!initSocketLayer(address->protocol()))
            return false;
    }

    return true;
}